

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lys_type * lyd_leaf_type(lyd_node_leaf_list *leaf)

{
  int iVar1;
  lys_type *local_20;
  lys_type *type;
  
  if (leaf == (lyd_node_leaf_list *)0x0) {
    return (lys_type *)0x0;
  }
  if ((leaf->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
LAB_001644fe:
    local_20 = (lys_type *)0x0;
  }
  else {
    local_20 = (lys_type *)&leaf->schema[1].ref;
    do {
      if (local_20->base == LY_TYPE_UNION) {
        if ((((local_20->info).uni.has_ptr_type != 0) && (leaf->validity != '\0')) ||
           (iVar1 = resolve_union(leaf,local_20,0,0,&local_20), iVar1 != 0)) goto LAB_001644fe;
      }
      else if (local_20->base == LY_TYPE_LEAFREF) {
        local_20 = &((local_20->info).lref.target)->type;
      }
    } while (local_20->base == LY_TYPE_LEAFREF);
  }
  return local_20;
}

Assistant:

lys_type *
lyd_leaf_type(const struct lyd_node_leaf_list *leaf)
{
    struct lys_type *type;

    if (!leaf || !(leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        return NULL;
    }

    type = &((struct lys_node_leaf *)leaf->schema)->type;

    do {
        if (type->base == LY_TYPE_LEAFREF) {
            type = &type->info.lref.target->type;
        } else if (type->base == LY_TYPE_UNION) {
            if (type->info.uni.has_ptr_type && leaf->validity) {
                /* we don't know what it will be after resolution (validation) */
                return NULL;
            }

            if (resolve_union((struct lyd_node_leaf_list *)leaf, type, 0, 0, &type)) {
                /* resolve union failed */
                return NULL;
            }
        }
    } while (type->base == LY_TYPE_LEAFREF);

    return type;
}